

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

vector<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_> *
pbrt::Image::ResampleWeights
          (vector<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>
           *__return_storage_ptr__,int oldRes,int newRes)

{
  Float *pFVar1;
  Float *pFVar2;
  pointer pRVar3;
  int j;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 extraout_var [12];
  undefined1 extraout_var_00 [12];
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  float fVar14;
  float fVar15;
  allocator_type local_5d;
  float local_5c;
  float local_58;
  float local_54;
  int vb;
  int va;
  undefined1 local_48 [16];
  
  vb = oldRes;
  va = newRes;
  if (oldRes <= newRes) {
    std::vector<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>::vector
              (__return_storage_ptr__,(long)newRes,&local_5d);
    if (0 < newRes) {
      auVar12 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
      local_54 = (float)oldRes;
      pRVar3 = (__return_storage_ptr__->
               super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>).
               _M_impl.super__Vector_impl_data._M_start;
      lVar7 = 4;
      local_58 = (float)newRes;
      uVar5 = 0;
      do {
        lVar4 = 0;
        fVar14 = (((float)(int)uVar5 + 0.5) * local_54) / local_58;
        auVar9 = ZEXT416((uint)(fVar14 + -2.0 + 0.5));
        auVar9 = vroundss_avx(auVar9,auVar9,9);
        pRVar3[uVar5].firstPixel = (int)auVar9._0_4_;
        local_5c = fVar14;
        do {
          fVar15 = ((float)(pRVar3[uVar5].firstPixel + (int)lVar4) + 0.5) - fVar14;
          fVar10 = 0.0;
          auVar9 = vandps_avx(ZEXT416((uint)fVar15),auVar12._0_16_);
          if (auVar9._0_4_ <= 2.0) {
            fVar10 = fVar15 * 3.1415927;
            auVar11 = SUB6416(ZEXT464(0x3f800000),0);
            auVar9 = vfmadd213ss_fma(ZEXT416((uint)fVar10),ZEXT416((uint)fVar10),auVar11);
            if ((auVar9._0_4_ != 1.0) || (NAN(auVar9._0_4_))) {
              local_48 = ZEXT416((uint)fVar15);
              fVar14 = sinf(fVar10);
              auVar11._0_4_ = fVar14 / fVar10;
              auVar11._4_12_ = extraout_var;
              auVar12 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
              fVar14 = local_5c;
              fVar15 = (float)local_48._0_4_;
            }
            fVar15 = fVar15 * 0.5 * 3.1415927;
            auVar13 = SUB6416(ZEXT464(0x3f800000),0);
            auVar9 = vfmadd213ss_fma(ZEXT416((uint)fVar15),ZEXT416((uint)fVar15),auVar13);
            if ((auVar9._0_4_ != 1.0) || (fVar10 = auVar11._0_4_, NAN(auVar9._0_4_))) {
              local_48._0_4_ = auVar11._0_4_;
              fVar14 = sinf(fVar15);
              auVar13._0_4_ = fVar14 / fVar15;
              auVar13._4_12_ = extraout_var_00;
              auVar12 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
              fVar10 = (float)local_48._0_4_;
              fVar14 = local_5c;
            }
            pRVar3 = (__return_storage_ptr__->
                     super__Vector_base<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            fVar10 = auVar13._0_4_ * fVar10;
          }
          *(float *)((long)pRVar3->weight + lVar4 * 4 + lVar7 + -4) = fVar10;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 4);
        uVar6 = uVar5 + 1;
        lVar7 = lVar7 + 0x14;
        fVar8 = 1.0 / (pRVar3[uVar5].weight[0] + pRVar3[uVar5].weight[1] + pRVar3[uVar5].weight[2] +
                      pRVar3[uVar5].weight[3]);
        pFVar1 = pRVar3[uVar5].weight;
        fVar14 = pFVar1[1];
        fVar10 = pFVar1[2];
        fVar15 = pFVar1[3];
        pFVar2 = pRVar3[uVar5].weight;
        *pFVar2 = fVar8 * *pFVar1;
        pFVar2[1] = fVar8 * fVar14;
        pFVar2[2] = fVar8 * fVar10;
        pFVar2[3] = fVar8 * fVar15;
        uVar5 = uVar6;
      } while (uVar6 != (uint)newRes);
    }
    return __return_storage_ptr__;
  }
  LogFatal<char_const(&)[7],char_const(&)[7],char_const(&)[7],int&,char_const(&)[7],int&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
             ,0xf5,"Check failed: %s >= %s with %s = %s, %s = %s",(char (*) [7])"newRes",
             (char (*) [7])"oldRes",(char (*) [7])"newRes",&va,(char (*) [7])"oldRes",&vb);
}

Assistant:

std::vector<ResampleWeight> Image::ResampleWeights(int oldRes, int newRes) {
    CHECK_GE(newRes, oldRes);
    std::vector<ResampleWeight> wt(newRes);
    Float filterRadius = 2, tau = 2;
    for (int i = 0; i < newRes; ++i) {
        // Compute image resampling weights for _i_th pixel
        Float center = (i + .5f) * oldRes / newRes;
        wt[i].firstPixel = std::floor((center - filterRadius) + 0.5f);
        for (int j = 0; j < 4; ++j) {
            Float pos = wt[i].firstPixel + j + .5f;
            wt[i].weight[j] = WindowedSinc(pos - center, filterRadius, tau);
        }

        // Normalize filter weights for pixel resampling
        Float invSumWts =
            1 / (wt[i].weight[0] + wt[i].weight[1] + wt[i].weight[2] + wt[i].weight[3]);
        for (int j = 0; j < 4; ++j)
            wt[i].weight[j] *= invSumWts;
    }
    return wt;
}